

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int choose_volume(archive_read *a,iso9660 *iso9660)

{
  char cVar1;
  int iVar2;
  uint64_t uVar3;
  uchar *puVar4;
  int64_t iVar5;
  char seenJoliet;
  void *block;
  vd *vd;
  int64_t skipsize;
  file_info *file;
  iso9660 *iso9660_local;
  archive_read *a_local;
  
  block = &iso9660->primary;
  if (iso9660->opt_support_joliet == 0) {
    iso9660->seenJoliet = '\0';
  }
  if ((iso9660->seenJoliet != '\0') && ((iso9660->joliet).location < ((vd *)block)->location)) {
    block = &iso9660->joliet;
  }
  uVar3 = __archive_read_consume(a,(long)*block << 0xb);
  if ((long)uVar3 < 0) {
    a_local._4_4_ = (int)uVar3;
  }
  else {
    iso9660->current_position = uVar3;
    puVar4 = (uchar *)__archive_read_ahead(a,(ulong)*(uint *)((long)block + 4),(ssize_t *)0x0);
    if (puVar4 == (uchar *)0x0) {
      archive_set_error(&a->archive,-1,
                        "Failed to read full block when scanning ISO9660 directory list");
      a_local._4_4_ = -0x1e;
    }
    else {
      cVar1 = iso9660->seenJoliet;
      iso9660->seenJoliet = '\0';
      skipsize = (int64_t)parse_file_info(a,(file_info *)0x0,puVar4,
                                          (ulong)*(uint *)((long)block + 4));
      if ((file_info *)skipsize == (file_info *)0x0) {
        a_local._4_4_ = -0x1e;
      }
      else {
        iso9660->seenJoliet = cVar1;
        if ((((vd *)block == &iso9660->primary) && (iso9660->seenRockridge != '\0')) &&
           (iso9660->seenJoliet != '\0')) {
          iso9660->seenJoliet = '\0';
        }
        if ((((vd *)block == &iso9660->primary) && (iso9660->seenRockridge == '\0')) &&
           (iso9660->seenJoliet != '\0')) {
          iVar5 = __archive_read_consume
                            (a,(long)(iso9660->joliet).location * 0x800 - iso9660->current_position)
          ;
          if (iVar5 < 0) {
            return (int)iVar5;
          }
          iso9660->current_position = iVar5 + iso9660->current_position;
          puVar4 = (uchar *)__archive_read_ahead(a,(ulong)(iso9660->joliet).size,(ssize_t *)0x0);
          if (puVar4 == (uchar *)0x0) {
            archive_set_error(&a->archive,-1,
                              "Failed to read full block when scanning ISO9660 directory list");
            return -0x1e;
          }
          iso9660->seenJoliet = '\0';
          skipsize = (int64_t)parse_file_info(a,(file_info *)0x0,puVar4,
                                              (ulong)(iso9660->joliet).size);
          if ((file_info *)skipsize == (file_info *)0x0) {
            return -0x1e;
          }
          iso9660->seenJoliet = cVar1;
        }
        iVar2 = heap_add_entry(a,&iso9660->pending_files,(file_info *)skipsize,
                               *(uint64_t *)(skipsize + 0x30));
        if (iVar2 == 0) {
          if (iso9660->seenRockridge != '\0') {
            (a->archive).archive_format = 0x40001;
            (a->archive).archive_format_name = "ISO9660 with Rockridge extensions";
          }
          a_local._4_4_ = 0;
        }
        else {
          a_local._4_4_ = -0x1e;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
choose_volume(struct archive_read *a, struct iso9660 *iso9660)
{
	struct file_info *file;
	int64_t skipsize;
	struct vd *vd;
	const void *block;
	char seenJoliet;

	vd = &(iso9660->primary);
	if (!iso9660->opt_support_joliet)
		iso9660->seenJoliet = 0;
	if (iso9660->seenJoliet &&
		vd->location > iso9660->joliet.location)
		/* This condition is unlikely; by way of caution. */
		vd = &(iso9660->joliet);

	skipsize = LOGICAL_BLOCK_SIZE * (int64_t)vd->location;
	skipsize = __archive_read_consume(a, skipsize);
	if (skipsize < 0)
		return ((int)skipsize);
	iso9660->current_position = skipsize;

	block = __archive_read_ahead(a, vd->size, NULL);
	if (block == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Failed to read full block when scanning "
		    "ISO9660 directory list");
		return (ARCHIVE_FATAL);
	}

	/*
	 * While reading Root Directory, flag seenJoliet must be zero to
	 * avoid converting special name 0x00(Current Directory) and
	 * next byte to UCS2.
	 */
	seenJoliet = iso9660->seenJoliet;/* Save flag. */
	iso9660->seenJoliet = 0;
	file = parse_file_info(a, NULL, block, vd->size);
	if (file == NULL)
		return (ARCHIVE_FATAL);
	iso9660->seenJoliet = seenJoliet;

	/*
	 * If the iso image has both RockRidge and Joliet, we preferentially
	 * use RockRidge Extensions rather than Joliet ones.
	 */
	if (vd == &(iso9660->primary) && iso9660->seenRockridge
	    && iso9660->seenJoliet)
		iso9660->seenJoliet = 0;

	if (vd == &(iso9660->primary) && !iso9660->seenRockridge
	    && iso9660->seenJoliet) {
		/* Switch reading data from primary to joliet. */
		vd = &(iso9660->joliet);
		skipsize = LOGICAL_BLOCK_SIZE * (int64_t)vd->location;
		skipsize -= iso9660->current_position;
		skipsize = __archive_read_consume(a, skipsize);
		if (skipsize < 0)
			return ((int)skipsize);
		iso9660->current_position += skipsize;

		block = __archive_read_ahead(a, vd->size, NULL);
		if (block == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Failed to read full block when scanning "
			    "ISO9660 directory list");
			return (ARCHIVE_FATAL);
		}
		iso9660->seenJoliet = 0;
		file = parse_file_info(a, NULL, block, vd->size);
		if (file == NULL)
			return (ARCHIVE_FATAL);
		iso9660->seenJoliet = seenJoliet;
	}

	/* Store the root directory in the pending list. */
	if (add_entry(a, iso9660, file) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	if (iso9660->seenRockridge) {
		a->archive.archive_format = ARCHIVE_FORMAT_ISO9660_ROCKRIDGE;
		a->archive.archive_format_name =
		    "ISO9660 with Rockridge extensions";
	}

	return (ARCHIVE_OK);
}